

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTreeVisitor.cpp
# Opt level: O3

void __thiscall PrintTreeVisitor::Visit(PrintTreeVisitor *this,MainClass *main_class)

{
  ofstream *poVar1;
  ostream *poVar2;
  
  PrintTabs(this);
  poVar1 = &this->stream_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Main class: ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(main_class->main_class_name_)._M_dataplus._M_p,
                      (main_class->main_class_name_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  this->number_of_tabs_ = this->number_of_tabs_ + 1;
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Main: ",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->stream_ + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this->number_of_tabs_ = this->number_of_tabs_ + 1;
  (**(main_class->main_->super_Statement).super_Node._vptr_Node)(main_class->main_,this);
  this->number_of_tabs_ = this->number_of_tabs_ + -1;
  (**(main_class->declarations_->super_Statement).super_Node._vptr_Node)
            (main_class->declarations_,this);
  this->number_of_tabs_ = this->number_of_tabs_ + -1;
  return;
}

Assistant:

void PrintTreeVisitor::Visit(MainClass* main_class) {
  PrintTabs();
  stream_ << "Main class: " << main_class->main_class_name_ << std::endl;

  ++number_of_tabs_;

  PrintTabs();
  stream_ << "Main: " << std::endl;

  ++number_of_tabs_;
  main_class->main_->Accept(this);
  --number_of_tabs_;

  --number_of_tabs_;

  ++number_of_tabs_;
  main_class->declarations_->Accept(this);
  --number_of_tabs_;
}